

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall
aiMetadata::Set<std::_Bit_reference>(aiMetadata *this,uint index,string *key,_Bit_reference *value)

{
  aiString *paVar1;
  ulong __n;
  aiString *paVar2;
  _Bit_type _Var3;
  bool bVar4;
  undefined8 *puVar5;
  
  if (index < this->mNumProperties) {
    __n = key->_M_string_length;
    if (__n == 0) {
      bVar4 = false;
    }
    else {
      if (__n < 0x400) {
        paVar2 = this->mKeys;
        paVar1 = paVar2 + index;
        paVar1->length = (ai_uint32)__n;
        memcpy(paVar1->data,(key->_M_dataplus)._M_p,__n);
        paVar2[index].data[__n] = '\0';
      }
      this->mValues[index].mType = AI_BOOL;
      puVar5 = (undefined8 *)operator_new(0x10);
      _Var3 = value->_M_mask;
      *puVar5 = value->_M_p;
      puVar5[1] = _Var3;
      this->mValues[index].mData = puVar5;
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

inline 
    bool Set( unsigned index, const std::string& key, const T& value ) {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Ensure that we have a valid key.
        if ( key.empty() ) {
            return false;
        }

        // Set metadata key
        mKeys[index] = key;

        // Set metadata type
        mValues[index].mType = GetAiType(value);
        // Copy the given value to the dynamic storage
        mValues[index].mData = new T(value);

        return true;
    }